

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu_snapshot.cpp
# Opt level: O0

void __thiscall Nes_Apu::save_snapshot(Nes_Apu *this,apu_snapshot_t *state)

{
  long in_RSI;
  Nes_Noise *in_RDI;
  Nes_Apu *apu;
  int i;
  Nes_Noise *state_00;
  uint local_14;
  
  for (local_14 = 0; (int)local_14 < 0x14; local_14 = local_14 + 1) {
    *(undefined1 *)(in_RSI + (int)local_14) =
         *(undefined1 *)
          (*(long *)((long)(in_RDI->super_Nes_Envelope).super_Nes_Osc.regs +
                    (long)((int)local_14 >> 2) * 4 * 2) + (long)(int)(local_14 & 3));
  }
  *(char *)(in_RSI + 0x11) = (char)in_RDI[2].synth.impulses[200];
  *(char *)(in_RSI + 0x14) = (char)in_RDI[3].synth.impulses[0xd1];
  *(char *)(in_RSI + 0x15) = (char)in_RDI[3].synth.impulses[0xd2];
  *(short *)(in_RSI + 0x16) = (short)in_RDI[3].synth.impulses[0xcf];
  *(char *)(in_RSI + 0x18) = (char)in_RDI[3].synth.impulses[0xd0];
  *(byte *)(in_RSI + 0x19) = (byte)in_RDI[3].synth.impulses[0xd3] & 1;
  state_00 = in_RDI;
  apu_reflection<1>::reflect_square((square_t *)in_RDI,(Nes_Square *)in_RDI);
  apu_reflection<1>::reflect_square((square_t *)state_00,(Nes_Square *)in_RDI);
  apu_reflection<1>::reflect_triangle
            ((triangle_t *)(in_RSI + 0x2e),(Nes_Triangle *)(state_00[1].synth.impulses + 0x1a));
  apu_reflection<1>::reflect_noise((noise_t *)state_00,in_RDI);
  apu_reflection<1>::reflect_dmc
            ((dmc_t *)(in_RSI + 0x3c),(Nes_Dmc *)(state_00[2].synth.impulses + 0xba));
  return;
}

Assistant:

void Nes_Apu::save_snapshot( apu_snapshot_t* state ) const
{
	for ( int i = 0; i < osc_count * 4; i++ )
		state->w40xx [i] = oscs [i >> 2]->regs [i & 3];
	state->w40xx [0x11] = dmc.dac;
	
	state->w4015    = osc_enables;
	state->w4017    = frame_mode;
	state->delay    = frame_delay;
	state->step     = frame;
	state->irq_flag = irq_flag;
	
	typedef apu_reflection<1> refl;
	Nes_Apu& apu = *(Nes_Apu*) this; // const_cast
	refl::reflect_square  ( state->square1,     apu.square1 );
	refl::reflect_square  ( state->square2,     apu.square2 );
	refl::reflect_triangle( state->triangle,    apu.triangle );
	refl::reflect_noise   ( state->noise,       apu.noise );
	refl::reflect_dmc     ( state->dmc,         apu.dmc );
}